

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::read_from_file(image_u8 *dest,char *pFilename,uint read_flags)

{
  bool bVar1;
  int iVar2;
  data_stream_serializer serializer;
  cfile_stream file_stream;
  data_stream_serializer local_70;
  cfile_stream local_60;
  
  if (read_flags < 2) {
    data_stream::data_stream(&local_60.super_data_stream);
    local_60.super_data_stream._vptr_data_stream = (_func_int **)&PTR__cfile_stream_001dde30;
    local_60.m_pFile = (FILE *)0x0;
    local_60.m_size._0_1_ = 0;
    local_60.m_size._1_7_ = 0;
    local_60.m_ofs._0_1_ = 0;
    local_60._49_8_ = 0;
    iVar2 = cfile_stream::open(&local_60,pFilename,5,0);
    if ((char)iVar2 == '\0') {
      bVar1 = false;
    }
    else {
      local_70.m_little_endian = true;
      local_70.m_pStream = &local_60.super_data_stream;
      bVar1 = read_from_stream(dest,&local_70,read_flags);
    }
    cfile_stream::~cfile_stream(&local_60);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool read_from_file(image_u8& dest, const char* pFilename, uint read_flags) {
  if (read_flags > cReadFlagsAllFlags) {
    CRNLIB_ASSERT(0);
    return false;
  }

  cfile_stream file_stream;
  if (!file_stream.open(pFilename))
    return false;

  data_stream_serializer serializer(file_stream);
  return read_from_stream(dest, serializer, read_flags);
}